

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O0

int do_decompress(Dwarf_Debug dbg,Dwarf_Section_s *section,Dwarf_Error *error)

{
  Dwarf_Small *error_00;
  Dwarf_Section_s *dbg_00;
  int iVar1;
  char *msg;
  Dwarf_Unsigned DVar2;
  size_t zsize;
  uLongf dlen;
  Dwarf_Error pDStack_158;
  int res;
  Dwarf_Unsigned max_inflated_len_1;
  Dwarf_Unsigned max_inflated_len;
  dwarfstring m;
  char buf [100];
  Dwarf_Byte_Ptr readend_1;
  Dwarf_Unsigned _ltmp_1;
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  uint structsize;
  uint fldsize;
  Dwarf_Unsigned size;
  Dwarf_Unsigned type;
  Dwarf_Small *ptr;
  uchar *c;
  uint l;
  uint i;
  Dwarf_Unsigned uncompressed_len;
  Dwarf_Small *pDStack_60;
  int zstdcompress;
  Dwarf_Small *endsection;
  Dwarf_Unsigned flags;
  Dwarf_Unsigned srclen;
  Dwarf_Unsigned destlen;
  Dwarf_Small *dest;
  Dwarf_Small *src;
  Dwarf_Small *basesrc;
  Dwarf_Error *error_local;
  Dwarf_Section_s *section_local;
  Dwarf_Debug dbg_local;
  
  dest = section->dss_data;
  destlen = 0;
  srclen = 0;
  flags = section->dss_size;
  endsection = (Dwarf_Small *)section->dss_flags;
  uncompressed_len._4_4_ = 0;
  _l = (Dwarf_Error)0x0;
  pDStack_60 = dest + section->dss_size;
  src = dest;
  basesrc = (Dwarf_Small *)error;
  error_local = (Dwarf_Error *)section;
  section_local = (Dwarf_Section_s *)dbg;
  if (pDStack_60 < dest + 0xc) {
    _dwarf_error_string(dbg,error,0x152,
                        "DW_DLE_ZLIB_SECTION_SHORTSection too short to be either zlib or zstd related"
                       );
    return 1;
  }
  section->dss_compressed_length = flags;
  iVar1 = strncmp("ZLIB",(char *)dest,4);
  if (iVar1 == 0) {
    c._0_4_ = 8;
    ptr = dest + 4;
    for (c._4_4_ = 0; c._4_4_ < 8; c._4_4_ = c._4_4_ + 1) {
      _l = (Dwarf_Error)((ulong)*ptr + (long)_l * 0x100);
      ptr = ptr + 1;
    }
    dest = dest + 0xc;
    flags = flags - 0xc;
    error_local[7] = _l;
    *(undefined1 *)((long)error_local + 0x4b) = 1;
  }
  else {
    if (((ulong)endsection & 0x800) == 0) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x13b,
                          "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD The compressed section is not properly formatted"
                         );
      return 1;
    }
    type = (Dwarf_Unsigned)dest;
    size = 0;
    _structsize = (Dwarf_Byte_Ptr)0x0;
    _ltmp._4_4_ = (uint)(byte)section_local[1].dss_addr;
    _ltmp._0_4_ = _ltmp._4_4_ * 3;
    readend = (Dwarf_Byte_Ptr)0x0;
    _ltmp_1 = (Dwarf_Unsigned)(dest + 4);
    if (_ltmp_1 < dest) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
      return 1;
    }
    if (pDStack_60 < _ltmp_1) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      return 1;
    }
    (*(code *)section_local[0x23].dss_standard_name)(&readend,dest,4);
    size = (Dwarf_Unsigned)readend;
    type = type + _ltmp._4_4_;
    readend_1 = (Dwarf_Byte_Ptr)0x0;
    if ((Dwarf_Small *)(type + _ltmp._4_4_) < type) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
      return 1;
    }
    if (pDStack_60 < (Dwarf_Small *)(type + _ltmp._4_4_)) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      return 1;
    }
    (*(code *)section_local[0x23].dss_standard_name)(&readend_1,type,_ltmp._4_4_);
    _structsize = readend_1;
    if (size != 1) {
      if (size != 2) {
        dwarfstring_constructor_static((dwarfstring_s *)&max_inflated_len,(char *)&m.s_malloc,100);
        dwarfstring_append_printf_u
                  ((dwarfstring *)&max_inflated_len,
                   "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD The SHF_COMPRESSED type field is 0x%x, neither zlib (1) or zstd(2). Corrupt dwarf."
                   ,size);
        dbg_00 = section_local;
        error_00 = basesrc;
        msg = dwarfstring_string((dwarfstring_s *)&max_inflated_len);
        _dwarf_error_string((Dwarf_Debug)dbg_00,(Dwarf_Error *)error_00,0x13b,msg);
        dwarfstring_destructor((dwarfstring_s *)&max_inflated_len);
        return 1;
      }
      uncompressed_len._4_4_ = 1;
    }
    _l = (Dwarf_Error)readend_1;
    error_local[7] = (Dwarf_Error)readend_1;
    dest = dest + (uint)_ltmp;
    flags = flags - (uint)_ltmp;
    *(undefined1 *)((long)error_local + 0x4a) = 1;
  }
  if (uncompressed_len._4_4_ == 0) {
    max_inflated_len_1 = flags << 4;
    if ((0x32 < flags) && (_l < (Dwarf_Error)(flags >> 1))) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x170,
                          "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zlib compressed section  isabsurdly small. Corrupt dwarf"
                         );
      return 1;
    }
    if (max_inflated_len_1 < flags) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x170,
                          "DW_DLE_ZLIB_UNCOMPRESS_ERROR: The zlib compressed section  is absurdly large so arithmentic overflow. So corrupt dwarf"
                         );
      return 1;
    }
    if (max_inflated_len_1 < _l) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x170,
                          "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zlib compressed section  is absurdly large given the input section length. So corrupt dwarf"
                         );
      return 1;
    }
  }
  if (uncompressed_len._4_4_ != 0) {
    pDStack_158 = (Dwarf_Error)(flags << 4);
    if ((0x32 < flags) && (_l < (Dwarf_Error)(flags >> 1))) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x170,
                          "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zstd compressed section  isabsurdly small. Corrupt dwarf"
                         );
      return 1;
    }
    if (pDStack_158 < flags) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x170,
                          "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zstd compressed section  is absurdly large so arithmentic overflow. So corrupt dwarf"
                         );
      return 1;
    }
    if (pDStack_158 < _l) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x170,
                          "DW_DLE_ZLIB_UNCOMPRESS_ERROR The zstd compressed section  is absurdly large given the input section length. So corrupt dwarf"
                         );
      return 1;
    }
  }
  if (pDStack_60 < dest + flags) {
    _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x152,
                        "DW_DLE_ZDEBUG_ZLIB_SECTION_SHORT The zstd or zlib compressed section  is longer than the section length. So corrupt dwarf"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    srclen = (Dwarf_Unsigned)_l;
    destlen = (Dwarf_Unsigned)malloc((size_t)_l);
    if ((void *)destlen == (void *)0x0) {
      _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x3e,
                          "DW_DLE_ALLOC_FAIL The zstd or zlib uncompressed space malloc failed: out of memory"
                         );
      dbg_local._4_4_ = 1;
    }
    else {
      if (uncompressed_len._4_4_ == 0) {
        dlen._4_4_ = 0;
        zsize = srclen;
        dlen._4_4_ = uncompress(destlen,&zsize,dest,flags);
        if (dlen._4_4_ == -5) {
          free((void *)destlen);
          _dwarf_error((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x13c);
          return 1;
        }
        if (dlen._4_4_ == -4) {
          free((void *)destlen);
          _dwarf_error((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x3e);
          return 1;
        }
        if (dlen._4_4_ != 0) {
          free((void *)destlen);
          _dwarf_error((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x13d);
          return 1;
        }
        dlen._4_4_ = 0;
      }
      if ((uncompressed_len._4_4_ == 0) ||
         (DVar2 = ZSTD_decompress(destlen,srclen,dest,flags), DVar2 == srclen)) {
        *error_local = (Dwarf_Error)destlen;
        error_local[1] = (Dwarf_Error)srclen;
        *(undefined1 *)(error_local + 5) = 1;
        *(undefined1 *)((long)error_local + 0x49) = 1;
        dbg_local._4_4_ = 0;
      }
      else {
        free((void *)destlen);
        _dwarf_error_string((Dwarf_Debug)section_local,(Dwarf_Error *)basesrc,0x13d,
                            "DW_DLE_ZLIB_DATA_ERROR The zstd ZSTD_decompress() failed.");
        dbg_local._4_4_ = 1;
      }
    }
  }
  return dbg_local._4_4_;
}

Assistant:

static int
do_decompress(Dwarf_Debug dbg,
    struct Dwarf_Section_s *section,
    Dwarf_Error * error)
{
    Dwarf_Small *basesrc = section->dss_data;
    Dwarf_Small *src = basesrc;
    Dwarf_Small *dest = 0;
    Dwarf_Unsigned destlen = 0;
    Dwarf_Unsigned srclen = section->dss_size;
    Dwarf_Unsigned flags = section->dss_flags;
    Dwarf_Small *endsection = 0;
    int zstdcompress = FALSE;
    Dwarf_Unsigned uncompressed_len = 0;

    endsection = basesrc + section->dss_size;
    if ((basesrc + 12) > endsection) {
        _dwarf_error_string(dbg, error,DW_DLE_ZLIB_SECTION_SHORT,
            "DW_DLE_ZLIB_SECTION_SHORT"
            "Section too short to be either zlib or zstd related");
        return DW_DLV_ERROR;
    }
    section->dss_compressed_length = srclen;
    if (!strncmp("ZLIB",(const char *)src,4)) {
        unsigned i = 0;
        unsigned l = 8;
        unsigned char *c = src+4;
        for ( ; i < l; ++i,c++) {
            uncompressed_len <<= 8;
            uncompressed_len += *c;
        }
        src = src + 12;
        srclen -= 12;
        section->dss_uncompressed_length = uncompressed_len;
        section->dss_ZLIB_compressed = TRUE;
    } else  if (flags & SHF_COMPRESSED) {
        /*  The prefix is a struct:
            unsigned int type; followed by pad if following are 64bit!
            size-of-target-address size
            size-of-target-address
        */
        Dwarf_Small *ptr    = (Dwarf_Small *)src;
        Dwarf_Unsigned type = 0;
        Dwarf_Unsigned size = 0;
        /* Dwarf_Unsigned addralign = 0; */
        unsigned fldsize    = dbg->de_pointer_size;
        unsigned structsize = 3* fldsize;
        READ_UNALIGNED_CK(dbg,type,Dwarf_Unsigned,ptr,
            DWARF_32BIT_SIZE,
            error,endsection);
        ptr += fldsize;
        READ_UNALIGNED_CK(dbg,size,Dwarf_Unsigned,ptr,fldsize,
            error,endsection);
        switch(type) {
        case ELFCOMPRESS_ZLIB:
            break;
        case ELFCOMPRESS_ZSTD:
            zstdcompress = TRUE;
            break;
        default: {
            char buf[100];
            dwarfstring m;

            dwarfstring_constructor_static(&m,buf,sizeof(buf));
            dwarfstring_append_printf_u(&m,
                "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD"
                " The SHF_COMPRESSED type field is 0x%x, neither"
                " zlib (1) or zstd(2). Corrupt dwarf.", type);
            _dwarf_error_string(dbg, error,
                DW_DLE_ZDEBUG_INPUT_FORMAT_ODD,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        }
        uncompressed_len = size;
        section->dss_uncompressed_length = uncompressed_len;
        src    += structsize;
        srclen -= structsize;
        section->dss_shf_compressed = TRUE;
    } else {
        _dwarf_error_string(dbg, error,
            DW_DLE_ZDEBUG_INPUT_FORMAT_ODD,
            "DW_DLE_ZDEBUG_INPUT_FORMAT_ODD"
            " The compressed section is not properly formatted");
        return DW_DLV_ERROR;
    }
    if (!zstdcompress) {
        /*  According to zlib.net zlib essentially never expands
            the data when compressing.  There is no statement
            about  any effective limit in the compression factor
            though we, here, assume  such a limit to check
            for sanity in the object file.
            These tests are heuristics.  */
        Dwarf_Unsigned max_inflated_len =
            srclen*ALLOWED_ZLIB_INFLATION;

        if (srclen > 50)  {
            /*  If srclen not super tiny lets check the following. */
            if (uncompressed_len < (srclen/2)) {
                /*  Violates the approximate invariant about
                    compression not actually inflating. */
                _dwarf_error_string(dbg, error,
                    DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                    "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                    " The zlib compressed section  is"
                    "absurdly small. Corrupt dwarf");
                return DW_DLV_ERROR;
            }
        }
        if (max_inflated_len < srclen) {
            /* The calculation overflowed. */
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR:"
                " The zlib compressed section  is"
                " absurdly large so arithmentic overflow."
                " So corrupt dwarf");
            return DW_DLV_ERROR;
        }
        if (uncompressed_len > max_inflated_len) {
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                " The zlib compressed section  is"
                " absurdly large given the input section"
                " length. So corrupt dwarf");
            return DW_DLV_ERROR;
        }
    }
    if (zstdcompress) {
        /*  According to zlib.net zlib essentially never expands
            the data when compressing.  There is no statement
            about  any effective limit in the compression factor
            though we, here, assume  such a limit to check
            for sanity in the object file.
            These tests are heuristics.  */
        Dwarf_Unsigned max_inflated_len =
            srclen*ALLOWED_ZSTD_INFLATION;

        if (srclen > 50)  {
            /*  If srclen not super tiny lets check the following. */
            if (uncompressed_len < (srclen/2)) {
                /*  Violates the approximate invariant about
                    compression not actually inflating. */
                _dwarf_error_string(dbg, error,
                    DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                    "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                    " The zstd compressed section  is"
                    "absurdly small. Corrupt dwarf");
                return DW_DLV_ERROR;
            }
        }
        if (max_inflated_len < srclen) {
            /* The calculation overflowed. */
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                " The zstd compressed section  is"
                " absurdly large so arithmentic overflow."
                " So corrupt dwarf");
            return DW_DLV_ERROR;
        }
        if (uncompressed_len > max_inflated_len) {
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_UNCOMPRESS_ERROR,
                "DW_DLE_ZLIB_UNCOMPRESS_ERROR"
                " The zstd compressed section  is"
                " absurdly large given the input section"
                " length. So corrupt dwarf");
            return DW_DLV_ERROR;
        }
    }
    if ((src +srclen) > endsection) {
        _dwarf_error_string(dbg, error,
            DW_DLE_ZLIB_SECTION_SHORT,
            "DW_DLE_ZDEBUG_ZLIB_SECTION_SHORT"
            " The zstd or zlib compressed section  is"
            " longer than the section"
            " length. So corrupt dwarf");
        return DW_DLV_ERROR;
    }
    destlen = uncompressed_len;
    dest = malloc(destlen);
    if (!dest) {
        _dwarf_error_string(dbg, error,
            DW_DLE_ALLOC_FAIL,
            "DW_DLE_ALLOC_FAIL"
            " The zstd or zlib uncompressed space"
            " malloc failed: out of memory");
        return DW_DLV_ERROR;
    }
    /*  uncompress is a zlib function. */
    if (!zstdcompress) {
        int res = 0;
        uLongf dlen = destlen;

        res = uncompress(dest,&dlen,src,srclen);
        if (res == Z_BUF_ERROR) {
            free(dest);
            DWARF_DBG_ERROR(dbg, DW_DLE_ZLIB_BUF_ERROR, DW_DLV_ERROR);
        } else if (res == Z_MEM_ERROR) {
            free(dest);
            DWARF_DBG_ERROR(dbg, DW_DLE_ALLOC_FAIL, DW_DLV_ERROR);
        } else if (res != Z_OK) {
            free(dest);
            /* Probably Z_DATA_ERROR. */
            DWARF_DBG_ERROR(dbg, DW_DLE_ZLIB_DATA_ERROR,
                DW_DLV_ERROR);
        }
    }
    if (zstdcompress) {
        size_t zsize =
            ZSTD_decompress(dest,destlen,src,srclen);
        if (zsize != destlen) {
            free(dest);
            _dwarf_error_string(dbg, error,
                DW_DLE_ZLIB_DATA_ERROR,
                "DW_DLE_ZLIB_DATA_ERROR"
                " The zstd ZSTD_decompress() failed.");
            return DW_DLV_ERROR;
        }
    }
    /* Z_OK */
    section->dss_data = dest;
    section->dss_size = destlen;
    section->dss_data_was_malloc = TRUE;
    section->dss_did_decompress = TRUE;
    return DW_DLV_OK;
}